

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall benchmark::internal::BenchmarkImp::Arg(BenchmarkImp *this,int x)

{
  pointer pvVar1;
  ulong uVar2;
  initializer_list<int> __l;
  allocator_type local_35;
  int local_34;
  vector<int,_std::allocator<int>_> local_30;
  
  pvVar1 = (this->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pvVar1 != (this->args_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) &&
      (uVar2 = (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start & 0x3fffffffc, uVar2 != 0x3fffffffc)) &&
     (uVar2 != 4)) {
    CheckHandler::CheckHandler
              ((CheckHandler *)&local_30,"ArgsCnt() == -1 || ArgsCnt() == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"Arg",0x204);
    CheckHandler::~CheckHandler((CheckHandler *)&local_30);
  }
  GetNullLogInstance();
  __l._M_len = 1;
  __l._M_array = &local_34;
  local_34 = x;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_35);
  std::
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  ::emplace_back<std::vector<int,std::allocator<int>>>
            ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              *)&this->args_,&local_30);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BenchmarkImp::Arg(int x) {
  CHECK(ArgsCnt() == -1 || ArgsCnt() == 1);
  args_.push_back({x});
}